

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_holding_base.hpp
# Opt level: O0

void __thiscall
prop::detail::PropertyHoldingBase<StringHolder>::copy<char_const(&)[4]>
          (PropertyHoldingBase<StringHolder> *this,char (*uref) [4])

{
  char *pcVar1;
  Type *ppcVar2;
  allocator local_41;
  char (*local_40) [4];
  string local_38;
  char (*local_18) [4];
  char (*uref_local) [4];
  PropertyHoldingBase<StringHolder> *this_local;
  
  local_40 = uref;
  local_18 = uref;
  uref_local = (char (*) [4])this;
  ppcVar2 = UnwrapIfProperty<const_char_*>::forward((Type *)&local_40);
  pcVar1 = *ppcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_41);
  StringHolder::operator=(&this->m_value,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void copy( V&& uref )
  {
    m_value = ::prop::detail::UnwrapIfProperty<
      typename ::prop::detail::CleanType< V > >::forward(
        std::forward< V >( uref ) );
  }